

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

mcpl_buffer_t * mcpl_internal_buf_create(mcpl_buffer_t *__return_storage_ptr__,size_t capacity)

{
  char *pcVar1;
  
  __return_storage_ptr__->size = 0;
  if (capacity == 0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = mcpl_internal_malloc(capacity);
  }
  __return_storage_ptr__->buf = pcVar1;
  __return_storage_ptr__->capacity = capacity;
  return __return_storage_ptr__;
}

Assistant:

MCPL_LOCAL mcpl_buffer_t mcpl_internal_buf_create( size_t capacity )
{
  mcpl_buffer_t res;
  res.size = 0;
  if ( capacity == 0 ) {
    res.buf = NULL;
    res.capacity = 0;
  } else {
    res.buf = mcpl_internal_malloc(capacity);
    res.capacity = capacity;
  }
  return res;
}